

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

QColor __thiscall QColorDialogPrivate::grabScreenColor(QColorDialogPrivate *this,QPoint *p)

{
  QColor QVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  QPoint *in_RSI;
  long in_FS_OFFSET;
  QScreen *screen;
  QImage i;
  QPixmap pixmap;
  QRect screenRect;
  long local_80;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 local_28 [16];
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = QGuiApplication::screenAt(in_RSI);
  if (local_80 == 0) {
    local_80 = QGuiApplication::primaryScreen();
  }
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = QScreen::geometry();
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = QPoint::x((QPoint *)0x73744a);
  iVar3 = QRect::x((QRect *)0x737460);
  iVar4 = QPoint::y((QPoint *)0x737476);
  iVar5 = QRect::y((QRect *)0x737484);
  QScreen::grabWindow((ulonglong)&local_48,(int)local_80,0,iVar2 - iVar3,iVar4 - iVar5);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::toImage();
  uVar6 = QImage::pixel((int)(QImage *)&local_68,0);
  QColor::QColor(&local_18,uVar6);
  QImage::~QImage((QImage *)&local_68);
  QPixmap::~QPixmap((QPixmap *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1._8_8_ = local_18._8_8_;
    QVar1._0_8_ = local_18._0_8_;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColorDialogPrivate::grabScreenColor(const QPoint &p)
{
    QScreen *screen = QGuiApplication::screenAt(p);
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    const QRect screenRect = screen->geometry();
    const QPixmap pixmap =
            screen->grabWindow(0, p.x() - screenRect.x(), p.y() - screenRect.y(), 1, 1);
    const QImage i = pixmap.toImage();
    return i.pixel(0, 0);
}